

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O3

void __thiscall
QHexMetadata::clearMetadata(QHexMetadata *this,qint64 line,ClearMetadataCallback *cb)

{
  byte bVar1;
  Entry *pEVar2;
  long lVar3;
  bool bVar4;
  Data<QHashPrivate::Node<long_long,_QList<QHexMetadataItem>_>_> *pDVar5;
  iterator abegin;
  iterator iVar6;
  iterator iVar7;
  uint uVar8;
  const_iterator key;
  QHexMetadata *this_00;
  ulong uVar9;
  QHexMetadataItem *n;
  iterator iVar10;
  _Any_data _Stack_70;
  code *pcStack_60;
  code *pcStack_58;
  code *pcStack_50;
  long local_48;
  QHexMetadata *local_40;
  qint64 local_38;
  
  key.i = (QHexMetadataItem *)&stack0xffffffffffffffc8;
  pcStack_50 = (code *)0x1cd7fc;
  local_38 = line;
  iVar10 = QHash<long_long,_QList<QHexMetadataItem>_>::find(&this->m_metadata,(longlong *)key.i);
  pDVar5 = iVar10.i.d;
  if (pDVar5 != (Data<QHashPrivate::Node<long_long,_QList<QHexMetadataItem>_>_> *)0x0 ||
      iVar10.i.bucket != 0) {
    uVar9 = iVar10.i.bucket >> 7;
    uVar8 = (uint)iVar10.i.bucket & 0x7f;
    pEVar2 = pDVar5->spans[uVar9].entries;
    bVar1 = pDVar5->spans[uVar9].offsets[uVar8];
    local_48 = *(long *)((long)&pEVar2[bVar1].storage + 0x18);
    pcStack_50 = (code *)0x1cd851;
    local_40 = this;
    abegin = QList<QHexMetadataItem>::begin
                       ((QList<QHexMetadataItem> *)((long)&pEVar2[bVar1].storage + 8));
    this_00 = (QHexMetadata *)
              ((long)&pDVar5->spans[uVar9].entries[pDVar5->spans[uVar9].offsets[uVar8]].storage + 8)
    ;
    pcStack_50 = (code *)0x1cd879;
    iVar6 = QList<QHexMetadataItem>::end((QList<QHexMetadataItem> *)this_00);
    if (abegin.i != iVar6.i) {
      do {
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          pcStack_50 = removeForeground;
          std::__throw_bad_function_call();
          _Stack_70._M_unused._M_object = (void *)0x0;
          _Stack_70._8_8_ = 0;
          pcStack_58 = std::
                       _Function_handler<bool_(QHexMetadataItem_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LongSoft[P]UEFITool/UEFITool/QHexView/src/model/qhexmetadata.cpp:53:31)>
                       ::_M_invoke;
          pcStack_60 = std::
                       _Function_handler<bool_(QHexMetadataItem_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LongSoft[P]UEFITool/UEFITool/QHexView/src/model/qhexmetadata.cpp:53:31)>
                       ::_M_manager;
          pcStack_50 = (code *)(uVar9 * 0x90);
          clearMetadata(this_00,(qint64)key.i,(ClearMetadataCallback *)&_Stack_70);
          if (pcStack_60 != (code *)0x0) {
            (*pcStack_60)(&_Stack_70,&_Stack_70,__destroy_functor);
          }
          return;
        }
        pcStack_50 = (code *)0x1cd89b;
        key.i = abegin.i;
        bVar4 = (*cb->_M_invoker)((_Any_data *)cb,abegin.i);
        if (bVar4) {
          pcStack_50 = (code *)0x1cd8ca;
          iVar6 = QList<QHexMetadataItem>::erase
                            ((QList<QHexMetadataItem> *)
                             ((long)&pDVar5->spans[uVar9].entries
                                     [pDVar5->spans[uVar9].offsets[uVar8]].storage + 8),abegin.i,
                             abegin.i + 1);
          key.i = abegin.i;
        }
        else {
          iVar6.i = abegin.i + 1;
        }
        this_00 = (QHexMetadata *)
                  ((long)&pDVar5->spans[uVar9].entries[pDVar5->spans[uVar9].offsets[uVar8]].storage
                  + 8);
        pcStack_50 = (code *)0x1cd8f7;
        iVar7 = QList<QHexMetadataItem>::end((QList<QHexMetadataItem> *)this_00);
        abegin.i = iVar6.i;
      } while (iVar6.i != iVar7.i);
    }
    lVar3 = *(long *)((long)&pDVar5->spans[uVar9].entries[pDVar5->spans[uVar9].offsets[uVar8]].
                             storage + 0x18);
    if (lVar3 == 0) {
      pcStack_50 = (code *)0x1cd942;
      removeMetadata(local_40,local_38);
    }
    else if (local_48 != lVar3) {
      pcStack_50 = (code *)0x1cd936;
      changed(local_40);
    }
  }
  return;
}

Assistant:

void QHexMetadata::clearMetadata(qint64 line, ClearMetadataCallback&& cb) {
    auto iit = m_metadata.find(line);
    if(iit == m_metadata.end())
        return;

    auto oldsize = iit->size();

    for(auto it = iit->begin(); it != iit->end();) {
        if(cb(*it))
            it = iit->erase(it);
        else
            it++;
    }

    if(iit->empty()) {
        this->removeMetadata(line);
        return;
    }

    if(oldsize != iit->size())
        Q_EMIT changed();
}